

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void errorOutput(string *errorMessage)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"============================================================");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = std::__cxx11::string::compare((char *)errorMessage);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the names of the input and output files."
                            );
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)errorMessage);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "============================================================");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void errorOutput(string errorMessage) {
    cerr << endl << endl << "============================================================" << endl;
    if (errorMessage.compare("") == 0) {
        cerr <<
             "Error: You need to provide the algorithm to solve the problem (bfs, dfs or dijkstra) with the "
                     "names of the input and output files." << endl;
    } else {
        cerr << errorMessage << endl;
    }
    cerr << "============================================================" << endl << endl;
}